

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_converters.h
# Opt level: O0

string * __thiscall
common::vector_to_string_abi_cxx11_
          (string *__return_storage_ptr__,common *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v)

{
  common *this_00;
  bool bVar1;
  reference ppVar2;
  ulong uVar3;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<int,_int> local_50;
  pair<int,_int> e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  allocator<char> local_1a;
  undefined1 local_19;
  common *local_18;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  v_local = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
            __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"{",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  this_00 = local_18;
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_18
                     );
  e = (pair<int,_int>)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)&e), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1);
    local_50 = *ppVar2;
    std::__cxx11::to_string(&local_f0,local_50.first);
    std::operator+(&local_d0,"(",&local_f0);
    std::operator+(&local_b0,&local_d0,",");
    std::__cxx11::to_string(&local_110,local_50.second);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,"),");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  uVar3 = std::__cxx11::string::size();
  if (1 < uVar3) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

const std::string vector_to_string(const std::vector<std::pair<int, int>>& v) {
  std::string s("{");
  for (auto e : v) {
    s += "(" + std::to_string(e.first) + "," + std::to_string(e.second) + "),";
  }
  if (s.size() > 1) s.pop_back();
  s += "}";
  return s;
}